

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O1

int teardown_container_add_offset_test(void **state_)

{
  uint8_t type;
  void *pvVar1;
  
  pvVar1 = *state_;
  type = *(uint8_t *)((long)pvVar1 + 0x1a);
  if (*(container_t **)((long)pvVar1 + 0x20) != (container_t *)0x0) {
    container_free(*(container_t **)((long)pvVar1 + 0x20),type);
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  if (*(container_t **)((long)pvVar1 + 0x28) != (container_t *)0x0) {
    container_free(*(container_t **)((long)pvVar1 + 0x28),type);
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  }
  if (*(container_t **)((long)pvVar1 + 0x30) != (container_t *)0x0) {
    container_free(*(container_t **)((long)pvVar1 + 0x30),type);
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  }
  if (*(container_t **)((long)pvVar1 + 0x38) != (container_t *)0x0) {
    container_free(*(container_t **)((long)pvVar1 + 0x38),type);
    *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  }
  if (*(container_t **)((long)pvVar1 + 0x40) != (container_t *)0x0) {
    container_free(*(container_t **)((long)pvVar1 + 0x40),type);
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  }
  return 0;
}

Assistant:

static int teardown_container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    if (state->in) {
        container_free(state->in, test.type);
        state->in = NULL;
    }
    if (state->lo) {
        container_free(state->lo, test.type);
        state->lo = NULL;
    }
    if (state->hi) {
        container_free(state->hi, test.type);
        state->hi = NULL;
    }
    if (state->lo_only) {
        container_free(state->lo_only, test.type);
        state->lo_only = NULL;
    }
    if (state->hi_only) {
        container_free(state->hi_only, test.type);
        state->hi_only = NULL;
    }

    return 0;
}